

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.cpp
# Opt level: O0

Var Js::JavascriptAsyncGenerator::EntryAwaitFulfilledCallback
              (RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  JavascriptAsyncGenerator *this;
  code *pcVar2;
  bool bVar3;
  int n;
  ScriptContext *this_00;
  ThreadContext *this_01;
  Var *values;
  undefined4 *puVar4;
  Var value_00;
  AsyncGeneratorCallbackFunction *pAVar5;
  JavascriptAsyncGenerator **ppJVar6;
  JavascriptLibrary *this_02;
  RecyclableObject *pRVar7;
  PendingState state;
  JavascriptAsyncGenerator *generator;
  AsyncGeneratorCallbackFunction *callbackFn;
  Var value;
  ArgumentReader args;
  Var *_argsVarArray;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  this_00 = RecyclableObject::GetScriptContext(function);
  this_01 = ScriptContext::GetThreadContext(this_00);
  ThreadContext::ProbeStack(this_01,0xc00,this_00,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.cpp"
                                ,0x79,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&value,(CallInfo *)&function_local,values);
  if (((uint)value & 0xffffff) == 1 || ((ulong)value & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.cpp"
                                ,0x7b,"(args.Info.Count > 1)","args.Info.Count > 1");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  value_00 = Arguments::operator[]((Arguments *)&value,1);
  pAVar5 = VarTo<Js::AsyncGeneratorCallbackFunction,Js::RecyclableObject>(function);
  ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptAsyncGenerator__
                      ((WriteBarrierPtr *)&pAVar5->generator);
  this = *ppJVar6;
  TVar1 = this->pendingState;
  this->pendingState = None;
  if (TVar1 == Await) {
    ResumeCoroutine(this,value_00,Normal);
  }
  else if (TVar1 == AwaitReturn) {
    ResumeCoroutine(this,value_00,Return);
  }
  else if (TVar1 == Yield) {
    ResolveNext(this,value_00);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.cpp"
                                ,0x90,"(false)","Expected an async generator pending state");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_02 = ScriptContext::GetLibrary(this_00);
  pRVar7 = JavascriptLibraryBase::GetUndefined(&this_02->super_JavascriptLibraryBase);
  return pRVar7;
}

Assistant:

Var JavascriptAsyncGenerator::EntryAwaitFulfilledCallback(
    RecyclableObject* function,
    CallInfo callInfo, ...)
{
    auto* scriptContext = function->GetScriptContext();

    PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);

    AssertOrFailFast(args.Info.Count > 1);

    Var value = args[1];
    auto* callbackFn = VarTo<AsyncGeneratorCallbackFunction>(function);
    JavascriptAsyncGenerator* generator = callbackFn->generator;

    PendingState state = generator->pendingState;
    generator->pendingState = PendingState::None;

    switch (state)
    {
        case PendingState::Await:
            generator->ResumeCoroutine(value, ResumeYieldKind::Normal);
            break;
        case PendingState::AwaitReturn:
            generator->ResumeCoroutine(value, ResumeYieldKind::Return);
            break;
        case PendingState::Yield:
            generator->ResolveNext(value);
            break;
        default:
            AssertMsg(false, "Expected an async generator pending state");
            break;
    }

    return scriptContext->GetLibrary()->GetUndefined();
}